

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::QuantizationParams::QuantizationParams
          (QuantizationParams *this,QuantizationParams *from)

{
  ulong uVar1;
  LookUpTableQuantizationParams *this_00;
  LinearQuantizationParams *this_01;
  undefined1 *puVar2;
  Arena *pAVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__QuantizationParams_004b5450;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  this->numberofbits_ = from->numberofbits_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x65) {
    clear_QuantizationType(this);
    this->_oneof_case_[0] = 0x65;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar3);
    (this->QuantizationType_).linearquantization_ = this_01;
    if (from->_oneof_case_[0] == 0x65) {
      puVar2 = (undefined1 *)(from->QuantizationType_).linearquantization_;
    }
    else {
      puVar2 = _LinearQuantizationParams_default_instance_;
    }
    LinearQuantizationParams::MergeFrom(this_01,(LinearQuantizationParams *)puVar2);
  }
  else if (from->_oneof_case_[0] == 0x66) {
    clear_QuantizationType(this);
    this->_oneof_case_[0] = 0x66;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_00 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::LookUpTableQuantizationParams>(pAVar3);
    (this->QuantizationType_).lookuptablequantization_ = this_00;
    if (from->_oneof_case_[0] == 0x66) {
      puVar2 = (undefined1 *)(from->QuantizationType_).lookuptablequantization_;
    }
    else {
      puVar2 = _LookUpTableQuantizationParams_default_instance_;
    }
    LookUpTableQuantizationParams::MergeFrom(this_00,(LookUpTableQuantizationParams *)puVar2);
  }
  return;
}

Assistant:

QuantizationParams::QuantizationParams(const QuantizationParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  numberofbits_ = from.numberofbits_;
  clear_has_QuantizationType();
  switch (from.QuantizationType_case()) {
    case kLinearQuantization: {
      _internal_mutable_linearquantization()->::CoreML::Specification::LinearQuantizationParams::MergeFrom(from._internal_linearquantization());
      break;
    }
    case kLookupTableQuantization: {
      _internal_mutable_lookuptablequantization()->::CoreML::Specification::LookUpTableQuantizationParams::MergeFrom(from._internal_lookuptablequantization());
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.QuantizationParams)
}